

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

int __thiscall
QTextMarkdownImporter::cbText(QTextMarkdownImporter *this,int textType,char *text,uint size)

{
  QLatin1StringView s_00;
  bool bVar1;
  int iVar2;
  char *t;
  QDebug *o;
  QTextList *pQVar3;
  QLoggingCategory *pQVar4;
  ulong uVar5;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int startIdx;
  char16_t *str;
  char16_t *str_1;
  QString debugInfo;
  QString s;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QTextBlockFormat bfmt_1;
  QTextBlockFormat bfmt;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffb78;
  PatternOption in_stack_fffffffffffffb7c;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffb80;
  QLatin1String *in_stack_fffffffffffffb88;
  QTextFormat *in_stack_fffffffffffffb90;
  QString *in_stack_fffffffffffffb98;
  QTextMarkdownImporter *in_stack_fffffffffffffba0;
  QStringBuilder<QLatin1String,_QString> *in_stack_fffffffffffffba8;
  QString *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbc8;
  int local_400;
  QDebug local_370;
  undefined1 local_368 [24];
  QLatin1StringView local_350;
  undefined1 local_318 [24];
  QLatin1StringView local_300;
  QString local_2b0;
  QUrl local_298 [11];
  QDebug local_240;
  QDebug local_238;
  QDebug local_230 [14];
  QDebug local_1c0 [4];
  undefined2 local_19a;
  QString local_198;
  undefined2 local_17a;
  QString local_178;
  QChar local_15a;
  QString local_158 [2];
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  uint local_104;
  QArrayDataPointer<char16_t> local_100;
  undefined1 local_e8 [28];
  uint local_cc;
  QArrayDataPointer<char16_t> local_c8;
  undefined1 local_b0 [24];
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0xf4) & 1) != 0) {
    insertBlock(in_stack_fffffffffffffba0);
  }
  if ((cbText(int,char_const*,unsigned_int)::openingBracket == '\0') &&
     (iVar2 = __cxa_guard_acquire(&cbText(int,char_const*,unsigned_int)::openingBracket), iVar2 != 0
     )) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_c8,(Data *)0x0,L"<[a-zA-Z]",9);
    QString::QString((QString *)in_stack_fffffffffffffb80,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffb80,
               in_stack_fffffffffffffb7c);
    QRegularExpression::QRegularExpression
              (&cbText::openingBracket,(QString *)local_b0,(QFlags_conflict *)(ulong)local_cc);
    QString::~QString((QString *)0x9ffd55);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffb80);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&cbText::openingBracket,&__dso_handle);
    __cxa_guard_release(&cbText(int,char_const*,unsigned_int)::openingBracket);
  }
  if ((cbText(int,char_const*,unsigned_int)::closingBracket == '\0') &&
     (iVar2 = __cxa_guard_acquire(&cbText(int,char_const*,unsigned_int)::closingBracket), iVar2 != 0
     )) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_100,(Data *)0x0,L"(/>|</)",7);
    QString::QString((QString *)in_stack_fffffffffffffb80,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffb80,
               in_stack_fffffffffffffb7c);
    QRegularExpression::QRegularExpression
              (&cbText::closingBracket,(QString *)local_e8,(QFlags_conflict *)(ulong)local_104);
    QString::~QString((QString *)0x9ffe43);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffb80);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&cbText::closingBracket,&__dso_handle);
    __cxa_guard_release(&cbText(int,char_const*,unsigned_int)::closingBracket);
  }
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  QString::fromUtf8((char *)in_stack_fffffffffffffba0,(qsizetype)in_stack_fffffffffffffb98);
  switch(in_ESI) {
  case 0:
    if (*(int *)(in_RDI + 0xa8) != 0) {
      QString::operator+=((QString *)in_stack_fffffffffffffb80,
                          (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QString::QString((QString *)0x9fff11);
      QString::operator=((QString *)in_stack_fffffffffffffb80,
                         (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QString::~QString((QString *)0x9fff33);
    }
    break;
  case 1:
    QChar::QChar<char16_t,_true>(&local_15a,L'�');
    QString::QString(local_158,local_15a);
    QString::operator=((QString *)in_stack_fffffffffffffb80,
                       (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QString::~QString((QString *)0x9fff81);
    break;
  case 2:
    local_17a = 10;
    QString::QString(&local_178,(QChar)0xa);
    QString::operator=((QString *)in_stack_fffffffffffffb80,
                       (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QString::~QString((QString *)0x9fffcc);
    break;
  case 3:
    local_19a = 0x20;
    QString::QString(&local_198,(QChar)0x20);
    QString::operator=((QString *)in_stack_fffffffffffffb80,
                       (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QString::~QString((QString *)0xa00017);
    break;
  case 4:
    if (*(int *)(in_RDI + 0xa8) == 0) {
      QTextCursor::insertHtml
                ((QTextCursor *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88);
    }
    else {
      QString::operator+=((QString *)in_stack_fffffffffffffb80,
                          (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    QString::QString((QString *)0xa00066);
    QString::operator=((QString *)in_stack_fffffffffffffb80,
                       (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QString::~QString((QString *)0xa00088);
    break;
  case 5:
    break;
  case 6:
    local_400 = 0;
    while (local_400 = QString::indexOf((QRegularExpression *)&local_128,0xe51d58,
                                        (QRegularExpressionMatch *)(long)local_400), -1 < local_400)
    {
      *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + 1;
      local_400 = local_400 + 2;
    }
    local_400 = 0;
    while (local_400 = QString::indexOf((QRegularExpression *)&local_128,0xe51d68,
                                        (QRegularExpressionMatch *)(long)local_400), -1 < local_400)
    {
      *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + -1;
      local_400 = local_400 + 2;
    }
    QString::operator+=((QString *)in_stack_fffffffffffffb80,
                        (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (*(int *)(in_RDI + 0xa8) == 0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      lcMD();
      anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffb80,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa001c4);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
                   (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (char *)0xa001dd);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc8);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88)
        ;
        QDebug::~QDebug(local_1c0);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      QTextCursor::insertHtml
                ((QTextCursor *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88);
      bVar1 = QList<QTextCharFormat>::isEmpty((QList<QTextCharFormat> *)0xa00250);
      if (bVar1) {
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)0xa00263);
        QTextCursor::setCharFormat
                  ((QTextCursor *)in_stack_fffffffffffffb90,
                   (QTextCharFormat *)in_stack_fffffffffffffb88);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0xa00282);
      }
      else {
        QStack<QTextCharFormat>::top((QStack<QTextCharFormat> *)0xa00292);
        QTextCursor::setCharFormat
                  ((QTextCursor *)in_stack_fffffffffffffb90,
                   (QTextCharFormat *)in_stack_fffffffffffffb88);
      }
      QString::QString((QString *)0xa002ac);
      QString::operator=((QString *)in_stack_fffffffffffffb80,
                         (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QString::~QString((QString *)0xa002cf);
    }
    QString::QString((QString *)0xa002dc);
    QString::operator=((QString *)in_stack_fffffffffffffb80,
                       (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    QString::~QString((QString *)0xa002fe);
  }
  if (*(int *)(in_RDI + 0xc0) == 7) {
    bVar1 = ::operator==((QString *)in_stack_fffffffffffffb80,
                         (QChar *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0xf4) = 1;
      QString::QString((QString *)0xa0036b);
      QString::operator=((QString *)in_stack_fffffffffffffb80,
                         (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QString::~QString((QString *)0xa0038d);
    }
  }
  else if (*(int *)(in_RDI + 0xc0) == 0xf) {
    QList<int>::append((QList<int> *)0xa00336,in_stack_fffffffffffffb7c);
  }
  if ((*(byte *)(in_RDI + 0xf8) & 1) == 0) {
    bVar1 = QString::isEmpty((QString *)0xa00604);
    if (!bVar1) {
      QTextCursor::insertText
                ((QTextCursor *)in_stack_fffffffffffffb88,(QString *)in_stack_fffffffffffffb80);
    }
    pQVar3 = QTextCursor::currentList((QTextCursor *)in_stack_fffffffffffffb90);
    if (pQVar3 != (QTextList *)0x0) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::blockFormat((QTextCursor *)in_stack_fffffffffffffb90);
      QTextBlockFormat::setIndent
                ((QTextBlockFormat *)in_stack_fffffffffffffb88,
                 (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
      QTextCursor::setBlockFormat
                ((QTextCursor *)in_stack_fffffffffffffb80,
                 (QTextBlockFormat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0xa00688);
    }
    pQVar4 = lcMD();
    uVar5 = QLoggingCategory::isEnabled((QtMsgType)pQVar4);
    if ((uVar5 & 1) != 0) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::blockFormat((QTextCursor *)in_stack_fffffffffffffb90);
      local_2b0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_2b0.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_2b0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0xa0070a);
      pQVar3 = QTextCursor::currentList((QTextCursor *)in_stack_fffffffffffffb90);
      if (pQVar3 != (QTextList *)0x0) {
        local_300 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
        QTextCursor::currentList((QTextCursor *)in_stack_fffffffffffffb90);
        QTextList::format((QTextList *)in_stack_fffffffffffffb90);
        iVar2 = QTextListFormat::indent((QTextListFormat *)0xa00766);
        QString::number((int)local_318,iVar2);
        ::operator+(in_stack_fffffffffffffb88,(QString *)in_stack_fffffffffffffb80);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_QString> *)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QString::operator=((QString *)in_stack_fffffffffffffb80,
                           (QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
        ;
        QString::~QString((QString *)0xa007ce);
        QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                  ((QStringBuilder<QLatin1String,_QString> *)0xa007db);
        QString::~QString((QString *)0xa007e8);
        QTextListFormat::~QTextListFormat((QTextListFormat *)0xa007f5);
      }
      bVar1 = QTextFormat::hasProperty
                        (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      if (bVar1) {
        local_350 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
        iVar2 = QTextFormat::intProperty
                          (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20)
                          );
        QString::number((int)local_368,iVar2);
        ::operator+(in_stack_fffffffffffffb88,(QString *)in_stack_fffffffffffffb80);
        ::operator+=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                  ((QStringBuilder<QLatin1String,_QString> *)0xa00896);
        QString::~QString((QString *)0xa008a3);
      }
      bVar1 = QTextFormat::hasProperty
                        (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      if (bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
        s_00.m_data = (char *)in_stack_fffffffffffffb98;
        s_00.m_size = (qsizetype)in_stack_fffffffffffffb90;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
                            ,s_00);
      }
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      lcMD();
      anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffb80,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_98), bVar1) {
        anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa00943);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
                   (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (char *)0xa0095c);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc8);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
        in_stack_fffffffffffffb80 =
             (QArrayDataPointer<char16_t> *)
             QDebug::operator<<((QDebug *)in_stack_fffffffffffffb90,
                                (QString *)in_stack_fffffffffffffb88);
        QtPrivate::asString(&local_2b0);
        QString::toLocal8Bit(in_stack_fffffffffffffb98);
        QByteArray::constData((QByteArray *)0xa009e6);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc8);
        in_stack_fffffffffffffb88 =
             (QLatin1String *)
             QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc8);
        QTextBlockFormat::indent((QTextBlockFormat *)0xa00a14);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
        in_stack_fffffffffffffb90 =
             (QTextFormat *)
             QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc8);
        QTextBlockFormat::textIndent((QTextBlockFormat *)0xa00a41);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,
                           (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        in_stack_fffffffffffffb98 =
             (QString *)
             QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc8);
        QTextBlockFormat::leftMargin((QTextBlockFormat *)0xa00a6c);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,
                           (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QTextBlockFormat::topMargin((QTextBlockFormat *)0xa00a88);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,
                           (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QTextBlockFormat::bottomMargin((QTextBlockFormat *)0xa00aa4);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,
                           (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QTextBlockFormat::rightMargin((QTextBlockFormat *)0xa00ac0);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb80,
                           (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        QByteArray::~QByteArray((QByteArray *)0xa00ad7);
        QDebug::~QDebug(&local_370);
        local_90 = (undefined1 *)((ulong)local_90 & 0xffffffffffffff00);
      }
      QString::~QString((QString *)0xa00afe);
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0xa00b0b);
    }
  }
  else {
    t = (char *)(in_RDI + 0xd0);
    ::QVariant::QVariant(&local_28,(QString *)&local_128);
    QTextFormat::setProperty
              (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (QVariant *)in_stack_fffffffffffffb80);
    ::QVariant::~QVariant(&local_28);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    lcMD();
    anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffb80,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
      anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa00442);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
                 (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 (char *)0xa0045b);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,t);
      QTextImageFormat::name
                ((QTextImageFormat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,t);
      QTextFormat::stringProperty
                (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,t);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88);
      o = QDebug::operator<<((QDebug *)in_stack_fffffffffffffb98,t);
      QDebug::QDebug(&local_238,o);
      QTextCursor::document
                ((QTextCursor *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      QTextDocument::baseUrl((QTextDocument *)in_stack_fffffffffffffb88);
      ::operator<<((Stream *)local_230,(QUrl *)&local_238);
      QDebug::~QDebug(local_230);
      QUrl::~QUrl(local_298);
      QDebug::~QDebug(&local_238);
      QString::~QString((QString *)0xa005a1);
      QString::~QString((QString *)0xa005ae);
      QDebug::~QDebug(&local_240);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
    }
    QTextCursor::insertImage
              ((QTextCursor *)in_stack_fffffffffffffb88,
               (QTextImageFormat *)in_stack_fffffffffffffb80);
  }
  QString::~QString((QString *)0xa00b2e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int QTextMarkdownImporter::cbText(int textType, const char *text, unsigned size)
{
    if (m_needsInsertBlock)
        insertBlock();
#if QT_CONFIG(regularexpression)
    static const QRegularExpression openingBracket(QStringLiteral("<[a-zA-Z]"));
    static const QRegularExpression closingBracket(QStringLiteral("(/>|</)"));
#endif
    QString s = QString::fromUtf8(text, int(size));

    switch (textType) {
    case MD_TEXT_NORMAL:
#if QT_CONFIG(regularexpression)
        if (m_htmlTagDepth) {
            m_htmlAccumulator += s;
            s = QString();
        }
#endif
        break;
    case MD_TEXT_NULLCHAR:
        s = QString(QChar(u'\xFFFD')); // CommonMark-required replacement for null
        break;
    case MD_TEXT_BR:
        s = QString(qtmi_Newline);
        break;
    case MD_TEXT_SOFTBR:
        s = QString(qtmi_Space);
        break;
    case MD_TEXT_CODE:
        // We'll see MD_SPAN_CODE too, which will set the char format, and that's enough.
        break;
#if QT_CONFIG(texthtmlparser)
    case MD_TEXT_ENTITY:
        if (m_htmlTagDepth)
            m_htmlAccumulator += s;
        else
            m_cursor.insertHtml(s);
        s = QString();
        break;
#endif
    case MD_TEXT_HTML:
        // count how many tags are opened and how many are closed
#if QT_CONFIG(regularexpression) && QT_CONFIG(texthtmlparser)
        {
            int startIdx = 0;
            while ((startIdx = s.indexOf(openingBracket, startIdx)) >= 0) {
                ++m_htmlTagDepth;
                startIdx += 2;
            }
            startIdx = 0;
            while ((startIdx = s.indexOf(closingBracket, startIdx)) >= 0) {
                --m_htmlTagDepth;
                startIdx += 2;
            }
        }
        m_htmlAccumulator += s;
        if (!m_htmlTagDepth) { // all open tags are now closed
            qCDebug(lcMD) << "HTML" << m_htmlAccumulator;
            m_cursor.insertHtml(m_htmlAccumulator);
            if (m_spanFormatStack.isEmpty())
                m_cursor.setCharFormat(QTextCharFormat());
            else
                m_cursor.setCharFormat(m_spanFormatStack.top());
            m_htmlAccumulator = QString();
        }
#endif
        s = QString();
        break;
    }

    switch (m_blockType) {
    case MD_BLOCK_TD:
        m_nonEmptyTableCells.append(m_tableCol);
        break;
    case MD_BLOCK_CODE:
        if (s == qtmi_Newline) {
            // defer a blank line until we see something else in the code block,
            // to avoid ending every code block with a gratuitous blank line
            m_needsInsertBlock = true;
            s = QString();
        }
        break;
    default:
        break;
    }

    if (m_imageSpan) {
        // TODO we don't yet support alt text with formatting, because of the cases where m_cursor
        // already inserted the text above.  Rather need to accumulate it in case we need it here.
        m_imageFormat.setProperty(QTextFormat::ImageAltText, s);
        qCDebug(lcMD) << "image" << m_imageFormat.name()
                      << "title" << m_imageFormat.stringProperty(QTextFormat::ImageTitle)
                      << "alt" << s << "relative to" << m_cursor.document()->baseUrl();
        m_cursor.insertImage(m_imageFormat);
        return 0; // no error
    }

    if (!s.isEmpty())
        m_cursor.insertText(s);
    if (m_cursor.currentList()) {
        // The list item will indent the list item's text, so we don't need indentation on the block.
        QTextBlockFormat bfmt = m_cursor.blockFormat();
        bfmt.setIndent(0);
        m_cursor.setBlockFormat(bfmt);
    }
    if (lcMD().isEnabled(QtDebugMsg)) {
        QTextBlockFormat bfmt = m_cursor.blockFormat();
        QString debugInfo;
        if (m_cursor.currentList())
            debugInfo = "in list at depth "_L1 + QString::number(m_cursor.currentList()->format().indent());
        if (bfmt.hasProperty(QTextFormat::BlockQuoteLevel))
            debugInfo += "in blockquote at depth "_L1 +
                    QString::number(bfmt.intProperty(QTextFormat::BlockQuoteLevel));
        if (bfmt.hasProperty(QTextFormat::BlockCodeLanguage))
            debugInfo += "in a code block"_L1;
        qCDebug(lcMD) << textType << "in block" << m_blockType << s << qPrintable(debugInfo)
                      << "bindent" << bfmt.indent() << "tindent" << bfmt.textIndent()
                      << "margins" << bfmt.leftMargin() << bfmt.topMargin() << bfmt.bottomMargin() << bfmt.rightMargin();
    }
    return 0; // no error
}